

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::verifyIntegerAnyOf
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLint *references,
          size_t referencesLength)

{
  ostringstream *this_00;
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  StateQueryMemoryWriteGuard<unsigned_char> local_19b;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_19b.m_preguard = 0xde;
  local_19b.m_value = 0xde;
  local_19b.m_postguard = 0xde;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&local_19b.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&local_19b,testCtx);
  if (bVar2) {
    if (referencesLength != 0) {
      sVar3 = 0;
      do {
        if ((bool)local_19b.m_value == (references[sVar3] != 0)) {
          return;
        }
        sVar3 = sVar3 + 1;
      } while (referencesLength != sVar3);
    }
    local_198._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"// ERROR: got ",0xe);
    pcVar1 = "mapped_ == GL_FALSE";
    if (local_19b.m_value == '\x01') {
      pcVar1 = "mapped_ == GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar1 + 0xb,(ulong)(local_19b.m_value != '\x01') + 7);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyIntegerAnyOf (tcu::TestContext& testCtx, GLenum name, const GLint references[], size_t referencesLength)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean> state;
	glGetBooleanv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	for (size_t ndx = 0; ndx < referencesLength; ++ndx)
	{
		const GLboolean expectedGLState = references[ndx] ? GL_TRUE : GL_FALSE;

		if (state == expectedGLState)
			return;
	}

	testCtx.getLog() << TestLog::Message << "// ERROR: got " << (state==GL_TRUE ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
	if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
}